

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pu.cpp
# Opt level: O0

void __thiscall PU_twoBaseValues_Test::TestBody(PU_twoBaseValues_Test *this)

{
  bool bVar1;
  char *pcVar2;
  double dVar3;
  AssertHelper local_110;
  Message local_108;
  unit local_100;
  unit local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_5;
  Message local_d8;
  unit local_d0;
  unit local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_4;
  Message local_a8;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_3;
  Message local_88;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_2;
  Message local_68;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_1;
  Message local_48 [3];
  double local_30;
  double local_28;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  PU_twoBaseValues_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_28 = units::convert<units::unit,units::unit>
                       (1.47,(unit *)&units::ohm,(unit *)&units::defunit,24.7,92.3);
  local_30 = 1.47;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_20,"convert(1.47, ohm, defunit, 24.7, 92.3)","1.47",&local_28,
             &local_30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_pu.cpp",
               0x3d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  dVar3 = units::convert<units::unit,units::unit>
                    (1.0,(unit *)&units::in,(unit *)&units::cm,5.7,19.36);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_60,"convert(1.0, in, cm, 5.7, 19.36)","2.54","test::tolerance",dVar3,
             2.54,1e-06);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_pu.cpp",
               0x3e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  dVar3 = units::convert<units::unit,units::unit>
                    (4.5,(unit *)&units::puMW,(unit *)&units::puA,100.0,80000.0);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_80,"convert(4.5, puMW, puA, 100, 80000)","4.5","0.00001",dVar3,4.5,
             1e-05);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_pu.cpp",
               0x40,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  dVar3 = units::convert<units::unit,units::unit>
                    (4.5,(unit *)&units::puMW,(unit *)&units::puMW,100.0,80.0);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_a0,"convert(4.5, puMW, puMW, 100, 80)","4.5","0.00001",dVar3,4.5,
             1e-05);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_pu.cpp",
               0x42,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  local_c8 = units::unit::operator*((unit *)&units::pu,(unit *)&units::m);
  local_d0 = units::unit::operator*((unit *)&units::pu,(unit *)&units::m);
  dVar3 = units::convert<units::unit,units::unit>(4.5,&local_c8,&local_d0,100.0,80.0);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_c0,"convert(4.5, pu * m, pu * m, 100, 80)","4.5 * 10.0 / 8.0",
             "0.00001",dVar3,5.625,1e-05);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_pu.cpp",
               0x45,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  local_f8 = units::unit::operator*((unit *)&units::pu,(unit *)&units::m);
  local_100 = units::unit::operator*((unit *)&units::pu,(unit *)&units::mm);
  dVar3 = units::convert<units::unit,units::unit>(0.1,&local_f8,&local_100,1.0,10.0);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_f0,"convert(0.1, pu * m, pu * mm, 1.0, 10)","10.0","0.00001",dVar3,
             10.0,1e-05);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_pu.cpp",
               0x47,pcVar2);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  return;
}

Assistant:

TEST(PU, twoBaseValues)
{
    EXPECT_EQ(convert(1.47, ohm, defunit, 24.7, 92.3), 1.47);
    EXPECT_NEAR(convert(1.0, in, cm, 5.7, 19.36), 2.54, test::tolerance);

    EXPECT_NEAR(convert(4.5, puMW, puA, 100, 80000), 4.5, 0.00001);

    EXPECT_NEAR(convert(4.5, puMW, puMW, 100, 80), 4.5, 0.00001);

    EXPECT_NEAR(
        convert(4.5, pu * m, pu * m, 100, 80), 4.5 * 10.0 / 8.0, 0.00001);

    EXPECT_NEAR(convert(0.1, pu * m, pu * mm, 1.0, 10), 10.0, 0.00001);
}